

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O2

void __thiscall
ScriptElement_NumTypeConstructor_Test::ScriptElement_NumTypeConstructor_Test
          (ScriptElement_NumTypeConstructor_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c4040;
  return;
}

Assistant:

TEST(ScriptElement, NumTypeConstructor) {
  ScriptElement num_elem = ScriptElement(144);

  EXPECT_EQ(ScriptElementType::kElementNumber, num_elem.GetType());
  EXPECT_EQ(ScriptOperator::OP_INVALIDOPCODE, num_elem.GetOpCode());
  EXPECT_EQ(ByteData("9000").GetBytes(), num_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(144, num_elem.GetNumber());
  EXPECT_EQ(ByteData("029000").GetBytes(), num_elem.GetData().GetBytes());
  EXPECT_STREQ("144", num_elem.ToString().c_str());
  EXPECT_FALSE(num_elem.IsBinary());
  EXPECT_TRUE(num_elem.IsNumber());
  EXPECT_FALSE(num_elem.IsOpCode());
}